

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformDefaultAction<ot::commissioner::Error(ot::commissioner::BbrDataset&,unsigned_short)>
          (FunctionMocker<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<ot::commissioner::Error> *this;
  Result local_70;
  ReferenceOrValueWrapper<ot::commissioner::Error> local_48;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>
  *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  FunctionMocker<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>::
  PerformDefaultAction
            (&local_70,
             (FunctionMocker<ot::commissioner::Error_(ot::commissioner::BbrDataset_&,_unsigned_short)>
              *)args_local,(ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<ot::commissioner::Error>::ReferenceOrValueWrapper(&local_48,&local_70);
  ActionResultHolder(this,&local_48);
  ReferenceOrValueWrapper<ot::commissioner::Error>::~ReferenceOrValueWrapper(&local_48);
  ot::commissioner::Error::~Error(&local_70);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }